

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,2ul>>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,double>,2ul>>
::compute_bounding_box<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_2UL>_>
           *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  bool bVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_RCX;
  box_base<pico_tree::internal::box<double,_2UL>_> *in_RDX;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RSI;
  undefined8 *in_RDI;
  box_base<pico_tree::internal::box<double,_2UL>_> *unaff_retaddr;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffd0;
  
  box_base<pico_tree::internal::box<double,_2UL>_>::fill_inverse_max(in_RDX);
  while( true ) {
    bVar1 = __gnu_cxx::operator<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    in_stack_ffffffffffffffc8 =
         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)*in_RDI;
    in_stack_ffffffffffffffd0 = in_RCX;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xfffffffffffffff8);
    space_wrapper<pico_tree::space_map<std::array<double,_2UL>_>_>::operator[]<int>
              ((space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_> *)
               in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    box_base<pico_tree::internal::box<double,_2UL>_>::fit
              (unaff_retaddr,(scalar_type *)in_RSI._M_current);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xfffffffffffffff8);
  }
  return;
}

Assistant:

inline void compute_bounding_box(
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    box.fill_inverse_max();
    for (; begin < end; ++begin) {
      box.fit(space_[*begin]);
    }
  }